

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O2

Try<bool> * __thiscall
async_simple::coro::syncAwait<async_simple::coro::Lazy<async_simple::Try<bool>>&>
          (Try<bool> *__return_storage_ptr__,coro *this,Lazy<async_simple::Try<bool>_> *lazy)

{
  byte bVar1;
  Try<bool> *__rhs;
  Condition cond;
  Try<async_simple::Try<bool>_> value;
  counting_semaphore<1L> local_3c;
  _Variant_storage<false,_std::monostate,_async_simple::Try<bool>,_std::__exception_ptr::exception_ptr>
  local_38;
  type_conflict local_20;
  
  if (*(long **)(*(long *)this + 0x18) != (long *)0x0) {
    bVar1 = (**(code **)(**(long **)(*(long *)this + 0x18) + 0x18))();
    logicAssert((bool)(bVar1 ^ 1),"do not sync await in the same executor with Lazy");
  }
  local_20.cond = (Condition *)&local_3c;
  local_3c._M_sem._M_counter = (__semaphore_impl)0;
  local_20.value = (Try<async_simple::Try<bool>_> *)&local_38;
  local_38._M_index = '\0';
  detail::LazyBase<async_simple::Try<bool>,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<async_simple::Try<bool>,_false> *)this,&local_20);
  std::counting_semaphore<1L>::acquire(&local_3c);
  __rhs = Try<async_simple::Try<bool>_>::value((Try<async_simple::Try<bool>_> *)&local_38);
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr>::_Move_ctor_base
            ((_Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             __return_storage_ptr__,
             (_Move_ctor_base<false,_std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
             __rhs);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_async_simple::Try<bool>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}